

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_resetNotEqualByNullVariable_Test::TestBody(Equality_resetNotEqualByNullVariable_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_100 [2];
  AssertHelper local_e0 [8];
  Message local_d8 [8];
  shared_ptr<libcellml::Entity> local_d0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88 [8];
  Message local_80 [8];
  shared_ptr<libcellml::Entity> local_78;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  undefined1 local_30 [8];
  ResetPtr r2;
  ResetPtr r1;
  Equality_resetNotEqualByNullVariable_Test *this_local;
  
  createInitialisedReset();
  createInitialisedReset();
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::shared_ptr<libcellml::Variable>::shared_ptr
            ((shared_ptr<libcellml::Variable> *)&gtest_ar_.message_,(nullptr_t)0x0);
  libcellml::Reset::setVariable((shared_ptr *)peVar3);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)&gtest_ar_.message_);
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Reset,void>
            (&local_78,(shared_ptr<libcellml::Reset> *)local_30);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_61 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_78);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_60,"r1->equals(r2)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x23e,pcVar4);
    testing::internal::AssertHelper::operator=(local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Reset,void>
            (&local_d0,
             (shared_ptr<libcellml::Reset> *)
             &r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar2) {
    testing::Message::Message(local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_100,local_b8,"r2->equals(r1)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x23f,pcVar4);
    testing::internal::AssertHelper::operator=(local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    std::__cxx11::string::~string((string *)local_100);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_30);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)
             &r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, resetNotEqualByNullVariable)
{
    libcellml::ResetPtr r1 = createInitialisedReset();
    libcellml::ResetPtr r2 = createInitialisedReset();

    r2->setVariable(nullptr);

    EXPECT_FALSE(r1->equals(r2));
    EXPECT_FALSE(r2->equals(r1));
}